

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genHeader_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string s;
  
  std::__cxx11::string::string((string *)&s,"DATAHANDLER",(allocator *)&bStack_1b8);
  std::operator+(&local_58,"#ifndef INCLUDE_",&s);
  std::operator+(&local_198,&local_58,"_HPP_\n");
  std::operator+(&local_178,&local_198,"#define INCLUDE_");
  std::operator+(&local_158,&local_178,&s);
  std::operator+(&local_138,&local_158,"_HPP_\n\n");
  std::operator+(&local_118,&local_138,"#include <algorithm>\n");
  std::operator+(&local_f8,&local_118,"#include <chrono>\n");
  std::operator+(&local_d8,&local_f8,"#include <cstring>\n");
  std::operator+(&local_b8,&local_d8,"#include <fstream>\n");
  std::operator+(&local_98,&local_b8,"#include <iostream>\n");
  std::operator+(&local_78,&local_98,"#include <thread>\n");
  std::operator+(&bStack_1b8,&local_78,"#include <unordered_map>\n");
  std::operator+(__return_storage_ptr__,&bStack_1b8,"#include <vector>\n\n");
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_58);
  offset_abi_cxx11_(&local_178,this,1);
  std::operator+(&local_158,"using namespace std::chrono;\n\nnamespace lmfao\n{\n",&local_178);
  std::operator+(&local_138,&local_158,
                 "//const std::string PATH_TO_DATA = \"/Users/Maximilian/Documents/");
  std::operator+(&local_118,&local_138,"Oxford/LMFAO/");
  std::operator+(&local_f8,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  std::operator+(&local_d8,&local_f8,"\";\n");
  offset_abi_cxx11_(&local_198,this,1);
  std::operator+(&local_b8,&local_d8,&local_198);
  std::operator+(&local_98,&local_b8,"const std::string PATH_TO_DATA = \"../../");
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  std::operator+(&bStack_1b8,&local_78,"\";\n\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genHeader()
{   
    std::string s = "DATAHANDLER";
    std::string header = "#ifndef INCLUDE_"+s+"_HPP_\n"+
        "#define INCLUDE_"+s+"_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
   header += "#include <parallel/algorithm>\n";
#endif
    
   header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"//const std::string PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
        "Oxford/LMFAO/"+PATH_TO_DATA+"\";\n"+
        offset(1)+"const std::string PATH_TO_DATA = \"../../"+PATH_TO_DATA+"\";\n\n";

   return header;
}